

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask28_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[4] = uVar1;
  uVar2 = in[5];
  out[4] = uVar2 << 0xc | uVar1;
  uVar2 = uVar2 >> 0x14;
  out[5] = uVar2;
  uVar1 = in[6];
  out[5] = uVar1 << 8 | uVar2;
  uVar1 = uVar1 >> 0x18;
  out[6] = uVar1;
  out[6] = in[7] << 4 | uVar1;
  uVar1 = in[8];
  out[7] = uVar1;
  uVar2 = in[9];
  out[7] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[8] = uVar2;
  uVar1 = in[10];
  out[8] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[9] = uVar1;
  uVar2 = in[0xb];
  out[9] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[10] = uVar2;
  uVar1 = in[0xc];
  out[10] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0xb] = uVar1;
  uVar2 = in[0xd];
  out[0xb] = uVar2 << 0xc | uVar1;
  uVar2 = uVar2 >> 0x14;
  out[0xc] = uVar2;
  uVar1 = in[0xe];
  out[0xc] = uVar1 << 8 | uVar2;
  uVar1 = uVar1 >> 0x18;
  out[0xd] = uVar1;
  out[0xd] = in[0xf] << 4 | uVar1;
  uVar1 = in[0x10];
  out[0xe] = uVar1;
  uVar2 = in[0x11];
  out[0xe] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[0xf] = uVar2;
  uVar1 = in[0x12];
  out[0xf] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[0x10] = uVar1;
  uVar2 = in[0x13];
  out[0x10] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[0x11] = uVar2;
  uVar1 = in[0x14];
  out[0x11] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0x12] = uVar1;
  uVar2 = in[0x15];
  out[0x12] = uVar2 << 0xc | uVar1;
  uVar2 = uVar2 >> 0x14;
  out[0x13] = uVar2;
  uVar1 = in[0x16];
  out[0x13] = uVar1 << 8 | uVar2;
  uVar1 = uVar1 >> 0x18;
  out[0x14] = uVar1;
  out[0x14] = in[0x17] << 4 | uVar1;
  return out + 0x15;
}

Assistant:

uint32_t *__fastpackwithoutmask28_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;

  return out;
}